

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_importInvalidComponentFromCellmlModelResetError_Test::
Importer_importInvalidComponentFromCellmlModelResetError_Test
          (Importer_importInvalidComponentFromCellmlModelResetError_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00169220;
  return;
}

Assistant:

TEST(Importer, importInvalidComponentFromCellmlModelResetError)
{
    auto e = "Encountered an error when resolving component 'component3_imported' from '" + resourcePath("importer/invalid_model.cellml") + "'.";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/import_invalid_component.cellml"));
    model->component(0)->setImportReference("component3");
    model->component(0)->setName("component3_imported");

    importer->resolveImports(model, resourcePath("importer"));
    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ(e, importer->error(0)->description());
}